

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLScanner::checkIDRefs(XMLScanner *this)

{
  int iVar1;
  undefined4 extraout_var;
  XMLRefInfo *pXVar2;
  RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> refEnum;
  RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> local_40;
  
  iVar1 = (*this->fValidationContext->_vptr_ValidationContext[2])();
  RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::
  RefHashTableOfEnumerator
            (&local_40,
             (RefHashTableOf<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher> *)
             CONCAT44(extraout_var,iVar1),false,this->fMemoryManager);
  while ((local_40.fCurElem != (RefHashTableBucketElem<xercesc_4_0::XMLRefInfo> *)0x0 ||
         (local_40.fCurHash != (local_40.fToEnum)->fHashModulus))) {
    pXVar2 = RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::
             nextElement(&local_40);
    if (((pXVar2->fDeclared == false) && (pXVar2->fUsed == true)) && (this->fValidate == true)) {
      XMLValidator::emitError
                (this->fValidator,IDNotDeclared,pXVar2->fRefName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  RefHashTableOfEnumerator<xercesc_4_0::XMLRefInfo,_xercesc_4_0::StringHasher>::
  ~RefHashTableOfEnumerator(&local_40);
  return;
}

Assistant:

void XMLScanner::checkIDRefs()
{
    //  Iterate the id ref list. If we find any entries here which are used
    //  but not declared, then that's an error.
    RefHashTableOfEnumerator<XMLRefInfo> refEnum(fValidationContext->getIdRefList(), false, fMemoryManager);
    while (refEnum.hasMoreElements())
    {
        // Get a ref to the current element
        const XMLRefInfo& curRef = refEnum.nextElement();

        // If its used but not declared, then its an error
        if (!curRef.getDeclared() && curRef.getUsed() && fValidate)
            fValidator->emitError(XMLValid::IDNotDeclared, curRef.getRefName());
    }
}